

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtableview.cpp
# Opt level: O0

void QTableView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  PenStyle PVar2;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  QTableView *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  QTableView *in_stack_00000008;
  void *_v_1;
  void *_v;
  QTableView *_t;
  bool in_stack_00000077;
  QTableView *in_stack_00000078;
  undefined8 in_stack_ffffffffffffffb8;
  int oldCount;
  QTableView *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined8 in_stack_ffffffffffffffd8;
  int column;
  PenStyle *pPVar4;
  int newIndex;
  
  if (in_ESI == 0) {
    oldCount = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    column = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    newIndex = (int)((ulong)in_RDI >> 0x20);
    iVar3 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    switch(in_EDX) {
    case 0:
      selectRow(in_stack_ffffffffffffffc0,oldCount);
      break;
    case 1:
      selectColumn(in_stack_ffffffffffffffc0,oldCount);
      break;
    case 2:
      hideRow(in_stack_ffffffffffffffc0,oldCount);
      break;
    case 3:
      hideColumn(in_stack_ffffffffffffffc0,oldCount);
      break;
    case 4:
      showRow(in_stack_ffffffffffffffc0,oldCount);
      break;
    case 5:
      showColumn(in_stack_ffffffffffffffc0,oldCount);
      break;
    case 6:
      resizeRowToContents(in_RDI,column);
      break;
    case 7:
      resizeRowsToContents(in_stack_ffffffffffffffc0);
      break;
    case 8:
      resizeColumnToContents(in_RDI,column);
      break;
    case 9:
      resizeColumnsToContents(in_stack_ffffffffffffffc0);
      break;
    case 10:
      sortByColumn(in_stack_ffffffffffffffc0,oldCount,(SortOrder)in_stack_ffffffffffffffb8);
      break;
    case 0xb:
      setShowGrid(in_stack_ffffffffffffffc0,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
      break;
    case 0xc:
      rowMoved(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,newIndex);
      break;
    case 0xd:
      columnMoved(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,newIndex);
      break;
    case 0xe:
      rowResized(in_RDI,column,(int)in_stack_ffffffffffffffd8,iVar3);
      break;
    case 0xf:
      columnResized(in_RDI,column,(int)in_stack_ffffffffffffffd8,iVar3);
      break;
    case 0x10:
      rowCountChanged(in_stack_ffffffffffffffc0,oldCount,(SortOrder)in_stack_ffffffffffffffb8);
      break;
    case 0x11:
      FUN_002aa860(in_RDI,*(undefined4 *)in_RCX[1],*(undefined4 *)in_RCX[2]);
    }
  }
  if (in_ESI == 1) {
    pPVar4 = (PenStyle *)*in_RCX;
    in_stack_ffffffffffffffc0 = (QTableView *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffffc0) {
    case (QTableView *)0x0:
      bVar1 = showGrid(in_stack_ffffffffffffffc0);
      *(bool *)pPVar4 = bVar1;
      break;
    case (QTableView *)0x1:
      PVar2 = gridStyle(in_stack_ffffffffffffffc0);
      *pPVar4 = PVar2;
      break;
    case (QTableView *)0x2:
      bVar1 = isSortingEnabled(in_stack_ffffffffffffffc0);
      *(bool *)pPVar4 = bVar1;
      break;
    case (QTableView *)0x3:
      bVar1 = wordWrap(in_stack_ffffffffffffffc0);
      *(bool *)pPVar4 = bVar1;
      break;
    case (QTableView *)0x4:
      bVar1 = isCornerButtonEnabled(in_stack_ffffffffffffffc0);
      *(bool *)pPVar4 = bVar1;
    }
  }
  if (in_ESI == 2) {
    switch(in_EDX) {
    case 0:
      setShowGrid(in_stack_ffffffffffffffc0,false);
      break;
    case 1:
      setGridStyle(in_stack_ffffffffffffffc0,NoPen);
      break;
    case 2:
      setSortingEnabled(in_stack_00000078,in_stack_00000077);
      break;
    case 3:
      setWordWrap(in_stack_ffffffffffffffc0,false);
      break;
    case 4:
      setCornerButtonEnabled(in_stack_ffffffffffffffc0,false);
    }
  }
  return;
}

Assistant:

void QTableView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTableView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->selectColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->hideRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->hideColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->showRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->showColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->resizeRowToContents((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->resizeRowsToContents(); break;
        case 8: _t->resizeColumnToContents((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->resizeColumnsToContents(); break;
        case 10: _t->sortByColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 11: _t->setShowGrid((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 12: _t->rowMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 13: _t->columnMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->rowResized((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 15: _t->columnResized((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 16: _t->rowCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 17: _t->columnCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->showGrid(); break;
        case 1: *reinterpret_cast<Qt::PenStyle*>(_v) = _t->gridStyle(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isCornerButtonEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setShowGrid(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setGridStyle(*reinterpret_cast<Qt::PenStyle*>(_v)); break;
        case 2: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setCornerButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}